

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_d2bc6b::HandleDirectoryMode
               (cmExecutionStatus *status,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *names,string *propertyName,string *propertyValue,bool appendAsString,bool appendMode
               ,bool remove)

{
  ulong uVar1;
  _Base_ptr p_Var2;
  bool bVar3;
  string *in_base;
  cmGlobalGenerator *this;
  cmMakefile *this_00;
  string local_78;
  string *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  uVar1 = (names->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  if (uVar1 < 2) {
    this_00 = status->Makefile;
    if (uVar1 != 0) {
      p_Var2 = (names->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      local_58 = propertyValue;
      in_base = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this_00);
      cmsys::SystemTools::CollapseFullPath(&local_78,(string *)(p_Var2 + 1),in_base);
      this = cmMakefile::GetGlobalGenerator(status->Makefile);
      this_00 = cmGlobalGenerator::FindMakefile(this,&local_78);
      if (this_00 == (cmMakefile *)0x0) {
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,
                   "DIRECTORY scope provided but requested directory was not found. This could be because the directory argument was invalid or, it is valid but has not been processed yet."
                   ,"");
        std::__cxx11::string::_M_assign((string *)&status->Error);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) goto LAB_002d2887;
        goto LAB_002d2894;
      }
      propertyValue = local_58;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        propertyValue = local_58;
      }
    }
    if (appendMode) {
      cmMakefile::AppendProperty(this_00,propertyName,propertyValue,appendAsString);
    }
    else if (remove) {
      cmMakefile::SetProperty(this_00,propertyName,(char *)0x0);
    }
    else {
      cmMakefile::SetProperty(this_00,propertyName,(cmValue)propertyValue);
    }
    bVar3 = true;
  }
  else {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"allows at most one name for DIRECTORY scope.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
LAB_002d2887:
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
LAB_002d2894:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool HandleDirectoryMode(cmExecutionStatus& status,
                         const std::set<std::string>& names,
                         const std::string& propertyName,
                         const std::string& propertyValue, bool appendAsString,
                         bool appendMode, bool remove)
{
  if (names.size() > 1) {
    status.SetError("allows at most one name for DIRECTORY scope.");
    return false;
  }

  // Default to the current directory.
  cmMakefile* mf = &status.GetMakefile();

  // Lookup the directory if given.
  if (!names.empty()) {
    // Construct the directory name.  Interpret relative paths with
    // respect to the current directory.
    std::string dir = cmSystemTools::CollapseFullPath(
      *names.begin(), status.GetMakefile().GetCurrentSourceDirectory());

    mf = status.GetMakefile().GetGlobalGenerator()->FindMakefile(dir);
    if (!mf) {
      // Could not find the directory.
      status.SetError(
        "DIRECTORY scope provided but requested directory was not found. "
        "This could be because the directory argument was invalid or, "
        "it is valid but has not been processed yet.");
      return false;
    }
  }

  // Set or append the property.
  if (appendMode) {
    mf->AppendProperty(propertyName, propertyValue, appendAsString);
  } else {
    if (remove) {
      mf->SetProperty(propertyName, nullptr);
    } else {
      mf->SetProperty(propertyName, propertyValue);
    }
  }

  return true;
}